

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_cert.cc
# Opt level: O0

int SSL_CTX_use_certificate_ASN1(SSL_CTX *ctx,int len,uchar *d)

{
  bool bVar1;
  CRYPTO_BUFFER *__p;
  pointer cert;
  undefined4 in_register_00000034;
  unique_ptr<crypto_buffer_st,_bssl::internal::Deleter> local_40;
  undefined4 local_34;
  unique_ptr<crypto_buffer_st,_bssl::internal::Deleter> local_30;
  UniquePtr<CRYPTO_BUFFER> buffer;
  uint8_t *der_local;
  size_t der_len_local;
  SSL_CTX *ctx_local;
  
  buffer._M_t.super___uniq_ptr_impl<crypto_buffer_st,_bssl::internal::Deleter>._M_t.
  super__Tuple_impl<0UL,_crypto_buffer_st_*,_bssl::internal::Deleter>.
  super__Head_base<0UL,_crypto_buffer_st_*,_false>._M_head_impl =
       (__uniq_ptr_data<crypto_buffer_st,_bssl::internal::Deleter,_true,_true>)
       (__uniq_ptr_data<crypto_buffer_st,_bssl::internal::Deleter,_true,_true>)d;
  __p = CRYPTO_BUFFER_new(d,CONCAT44(in_register_00000034,len),(CRYPTO_BUFFER_POOL *)0x0);
  std::unique_ptr<crypto_buffer_st,bssl::internal::Deleter>::
  unique_ptr<bssl::internal::Deleter,void>
            ((unique_ptr<crypto_buffer_st,bssl::internal::Deleter> *)&local_30,__p);
  bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&local_30);
  if (bVar1) {
    cert = std::unique_ptr<bssl::CERT,_bssl::internal::Deleter>::get
                     ((unique_ptr<bssl::CERT,_bssl::internal::Deleter> *)&ctx->read_ahead);
    std::unique_ptr<crypto_buffer_st,_bssl::internal::Deleter>::unique_ptr(&local_40,&local_30);
    bVar1 = bssl::ssl_set_cert(cert,&local_40);
    ctx_local._4_4_ = (uint)bVar1;
    std::unique_ptr<crypto_buffer_st,_bssl::internal::Deleter>::~unique_ptr(&local_40);
  }
  else {
    ctx_local._4_4_ = 0;
  }
  local_34 = 1;
  std::unique_ptr<crypto_buffer_st,_bssl::internal::Deleter>::~unique_ptr(&local_30);
  return ctx_local._4_4_;
}

Assistant:

int SSL_CTX_use_certificate_ASN1(SSL_CTX *ctx, size_t der_len,
                                 const uint8_t *der) {
  UniquePtr<CRYPTO_BUFFER> buffer(CRYPTO_BUFFER_new(der, der_len, NULL));
  if (!buffer) {
    return 0;
  }

  return ssl_set_cert(ctx->cert.get(), std::move(buffer));
}